

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O1

int RDL_timeout_stop_fun(void *p_timeout)

{
  uint uVar1;
  time_t tVar2;
  
  if (p_timeout != (void *)0x0) {
    RDL_timeout_stop_fun::timeout = *p_timeout;
    RDL_timeout_stop_fun::start = time((time_t *)0x0);
  }
  uVar1 = 0;
  if ((-1 < RDL_timeout_stop_fun::timeout) && (-1 < RDL_timeout_stop_fun::start)) {
    tVar2 = time((time_t *)0x0);
    uVar1 = (uint)((long)RDL_timeout_stop_fun::timeout < tVar2 - RDL_timeout_stop_fun::start);
  }
  return uVar1;
}

Assistant:

int RDL_timeout_stop_fun(const void* p_timeout)
{
  static int timeout = -1;
  static time_t start = -1;
  time_t end;

  if (p_timeout) {
    timeout = *(int*)p_timeout;
    start = time(NULL);
  }

  if (timeout < 0 || start < 0) {
    return 0;
  }
  else {
    end = time(NULL);
    if (end - start > timeout) {
      return 1;
    }
    else {
      return 0;
    }
  }
}